

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O1

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Init
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t max_elems)

{
  uchar **ppuVar1;
  uint8_t *puVar2;
  uint16_t *puVar3;
  ulong uVar4;
  
  DeleteAll(this);
  this->max_elems_ = max_elems;
  ppuVar1 = (uchar **)operator_new__(-(ulong)(max_elems >> 0x3d != 0) | max_elems * 8);
  this->temp_ = ppuVar1;
  puVar2 = (uint8_t *)operator_new__(max_elems);
  this->letters8_ = puVar2;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)max_elems) {
    uVar4 = max_elems * 2;
  }
  puVar3 = (uint16_t *)operator_new__(uVar4);
  this->letters16_ = puVar3;
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>::Init(size_t max_elems) {
  DeleteAll();

  max_elems_ = max_elems;
  temp_ = new StringType[max_elems];
  letters8_ = new uint8_t[max_elems];
  letters16_ = new uint16_t[max_elems];
  PSRS_CHECK(temp_ != NULL && letters8_ != NULL && letters16_ != NULL);
}